

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_stats_scan_sse41_128_64.c
# Opt level: O0

parasail_result_t *
parasail_sw_stats_table_scan_profile_sse41_128_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  int iVar1;
  parasail_matrix_t *ppVar2;
  void *pvVar3;
  void *pvVar4;
  void *pvVar5;
  longlong lVar6;
  longlong lVar7;
  longlong lVar8;
  longlong lVar9;
  longlong lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  int iVar71;
  int iVar72;
  long lVar73;
  __m128i *b;
  __m128i *b_00;
  __m128i *b_01;
  __m128i *b_02;
  __m128i *b_03;
  __m128i *b_04;
  __m128i *b_05;
  __m128i *b_06;
  __m128i *ptr;
  __m128i *ptr_00;
  __m128i *ptr_01;
  longlong *ptr_02;
  __m128i *ptr_03;
  __m128i *ptr_04;
  __m128i *palVar74;
  long *plVar75;
  uint uVar76;
  size_t len;
  long lVar77;
  longlong lVar78;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  longlong extraout_RDX_04;
  longlong extraout_RDX_05;
  longlong extraout_RDX_06;
  ulong extraout_RDX_07;
  ulong extraout_RDX_09;
  longlong *array;
  int32_t in_R9D;
  undefined8 extraout_XMM0_Qa;
  longlong extraout_XMM0_Qa_00;
  ulong extraout_XMM0_Qa_01;
  longlong extraout_XMM0_Qa_02;
  long lVar81;
  long lVar82;
  undefined1 *puVar83;
  undefined8 extraout_XMM0_Qa_03;
  longlong extraout_XMM0_Qa_04;
  ulong extraout_XMM0_Qa_05;
  longlong extraout_XMM0_Qa_06;
  ulong extraout_XMM0_Qa_07;
  longlong extraout_XMM0_Qa_08;
  undefined8 extraout_XMM0_Qa_09;
  long extraout_XMM0_Qa_10;
  undefined8 extraout_XMM0_Qa_11;
  long extraout_XMM0_Qa_12;
  undefined8 extraout_XMM0_Qa_13;
  undefined8 extraout_XMM0_Qa_14;
  ulong extraout_XMM0_Qa_15;
  ulong extraout_XMM0_Qa_16;
  undefined8 extraout_XMM0_Qb;
  longlong extraout_XMM0_Qb_00;
  ulong extraout_XMM0_Qb_01;
  ulong uVar84;
  longlong extraout_XMM0_Qb_02;
  long lVar85;
  long lVar86;
  undefined8 extraout_XMM0_Qb_03;
  longlong extraout_XMM0_Qb_04;
  ulong extraout_XMM0_Qb_05;
  ulong uVar87;
  longlong extraout_XMM0_Qb_06;
  ulong extraout_XMM0_Qb_07;
  longlong extraout_XMM0_Qb_08;
  undefined8 extraout_XMM0_Qb_09;
  long extraout_XMM0_Qb_10;
  undefined8 extraout_XMM0_Qb_11;
  long extraout_XMM0_Qb_12;
  undefined8 extraout_XMM0_Qb_13;
  ulong extraout_XMM0_Qb_14;
  ulong extraout_XMM0_Qb_15;
  ulong extraout_XMM0_Qb_16;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  __m128i alVar91;
  __m128i alVar92;
  __m128i alVar93;
  __m128i alVar94;
  __m128i alVar95;
  __m128i c;
  __m128i vH_00;
  __m128i vH_01;
  __m128i vH_02;
  __m128i vH_03;
  __m128i b_07;
  __m128i b_08;
  __m128i b_09;
  __m128i b_10;
  __m128i b_11;
  __m128i b_12;
  __m128i b_13;
  __m128i b_14;
  __m128i b_15;
  __m128i b_16;
  __m128i b_17;
  __m128i b_18;
  __m128i b_19;
  __m128i b_20;
  __m128i b_21;
  __m128i b_22;
  __m128i b_23;
  __m128i b_24;
  __m128i b_25;
  __m128i b_26;
  __m128i b_27;
  __m128i b_28;
  __m128i b_29;
  __m128i b_30;
  __m128i b_31;
  __m128i b_32;
  __m128i b_33;
  __m128i a;
  __m128i a_00;
  __m128i a_01;
  __m128i a_02;
  __m128i a_03;
  __m128i a_04;
  __m128i a_05;
  __m128i a_06;
  __m128i a_07;
  __m128i a_08;
  __m128i a_09;
  __m128i a_10;
  __m128i a_11;
  __m128i a_12;
  __m128i a_13;
  __m128i a_14;
  __m128i a_15;
  __m128i a_16;
  __m128i a_17;
  __m128i a_18;
  __m128i a_19;
  __m128i a_20;
  __m128i a_21;
  __m128i a_22;
  __m128i a_23;
  __m128i a_24;
  __m128i a_25;
  __m128i a_26;
  __m128i alVar96;
  __m128i alVar97;
  undefined8 in_stack_ffffffffffffecd8;
  int32_t temp;
  int32_t column_len;
  int64_t *l;
  int64_t *s;
  int64_t *m;
  int64_t *t;
  __m128i vCompare;
  __m128i cond_max;
  __m128i vFtL;
  __m128i vFtS;
  __m128i vFtM;
  __m128i vFt;
  __m128i vGapperL_1;
  __m128i vGapper_1;
  __m128i case0;
  __m128i case2;
  __m128i case1;
  __m128i vWS;
  __m128i *pvWS;
  __m128i vWM;
  __m128i *pvWM;
  __m128i vW;
  __m128i *pvW;
  __m128i vHpL;
  __m128i vHpS;
  __m128i vHpM;
  __m128i vHp;
  __m128i vHL;
  __m128i vHS;
  __m128i vHM;
  __m128i vH;
  __m128i vFL;
  __m128i vFS;
  __m128i vFM;
  __m128i vF_opn;
  __m128i vF_ext;
  __m128i vF;
  __m128i vHtL;
  __m128i vHtS;
  __m128i vHtM;
  __m128i vHt;
  __m128i vEL;
  __m128i vES;
  __m128i vEM;
  __m128i vE_opn;
  __m128i vE_ext;
  __m128i vE;
  __m128i vGapperL;
  __m128i vGapper;
  parasail_result_t *result;
  __m128i vSegLen;
  __m128i vSegLenXgap;
  __m128i vNegInfFront;
  __m128i vMaxHUnit;
  __m128i vMaxL;
  __m128i vMaxS;
  __m128i vMaxM;
  __m128i vMaxH;
  __m128i vSaturationCheckMax;
  __m128i vSaturationCheckMin;
  __m128i vPosLimit;
  __m128i vNegLimit;
  int64_t length;
  int64_t similar;
  int64_t matches;
  int64_t score;
  __m128i vOne;
  __m128i vZero;
  int64_t POS_LIMIT;
  int64_t NEG_LIMIT;
  __m128i vGapE;
  __m128i vGapO;
  __m128i *pvGapperL;
  __m128i *pvGapper;
  __m128i *pvHLMax;
  __m128i *pvHSMax;
  __m128i *pvHMMax;
  __m128i *pvHMax;
  __m128i *pvHL;
  __m128i *pvHS;
  __m128i *pvHM;
  __m128i *pvH;
  __m128i *pvEL;
  __m128i *pvES;
  __m128i *pvEM;
  __m128i *pvE;
  __m128i *pvPs;
  __m128i *pvPm;
  __m128i *pvP;
  int32_t segLen;
  int32_t segWidth;
  parasail_matrix_t *matrix;
  int32_t s1Len;
  int32_t end_ref;
  int32_t end_query;
  int32_t j;
  int32_t i;
  int gap_local;
  int open_local;
  int s2Len_local;
  char *s2_local;
  parasail_profile_t *profile_local;
  ulong uVar79;
  longlong lVar80;
  longlong extraout_RDX_08;
  
  if (profile == (parasail_profile_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_stats_table_scan_profile_sse41_128_64","profile"
           );
    profile_local = (parasail_profile_t *)0x0;
  }
  else if ((profile->profile64).score == (void *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_stats_table_scan_profile_sse41_128_64",
            "profile->profile64.score");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (profile->matrix == (parasail_matrix_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_stats_table_scan_profile_sse41_128_64",
            "profile->matrix");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (profile->s1Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sw_stats_table_scan_profile_sse41_128_64",
            "profile->s1Len");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (s2 == (char *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_stats_table_scan_profile_sse41_128_64","s2");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (s2Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sw_stats_table_scan_profile_sse41_128_64",
            "s2Len");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (open < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sw_stats_table_scan_profile_sse41_128_64",
            "open");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (gap < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sw_stats_table_scan_profile_sse41_128_64",
            "gap");
    profile_local = (parasail_profile_t *)0x0;
  }
  else {
    matrix._4_4_ = 0;
    s1Len = profile->s1Len;
    ppVar2 = profile->matrix;
    iVar71 = (s1Len + 1) / 2;
    pvVar3 = (profile->profile64).score;
    pvVar4 = (profile->profile64).matches;
    pvVar5 = (profile->profile64).similar;
    if (-open < ppVar2->min) {
      lVar73 = (long)open;
    }
    else {
      lVar73 = -(long)ppVar2->min;
    }
    lVar73 = lVar73 + -0x7fffffffffffffff;
    similar = 0;
    length = 0;
    vNegLimit[1] = 0;
    vMaxM[0] = lVar73;
    vMaxS[1] = lVar73;
    vMaxS[0] = lVar73;
    vMaxL[1] = lVar73;
    vMaxL[0] = lVar73;
    vMaxHUnit[1] = lVar73;
    profile_local = (parasail_profile_t *)parasail_result_new_table3(iVar71 * 2,s2Len);
    if (profile_local == (parasail_profile_t *)0x0) {
      profile_local = (parasail_profile_t *)0x0;
    }
    else {
      *(uint *)&profile_local->field_0xc = *(uint *)&profile_local->field_0xc | 0x2810404;
      uVar76 = *(uint *)&profile_local->field_0xc | 0x20000;
      len = (size_t)uVar76;
      *(uint *)&profile_local->field_0xc = uVar76;
      b = parasail_memalign___m128i(0x10,(long)iVar71);
      b_00 = parasail_memalign___m128i(0x10,(long)iVar71);
      b_01 = parasail_memalign___m128i(0x10,(long)iVar71);
      b_02 = parasail_memalign___m128i(0x10,(long)iVar71);
      b_03 = parasail_memalign___m128i(0x10,(long)iVar71);
      b_04 = parasail_memalign___m128i(0x10,(long)iVar71);
      b_05 = parasail_memalign___m128i(0x10,(long)iVar71);
      b_06 = parasail_memalign___m128i(0x10,(long)iVar71);
      ptr = parasail_memalign___m128i(0x10,(long)iVar71);
      ptr_00 = parasail_memalign___m128i(0x10,(long)iVar71);
      ptr_01 = parasail_memalign___m128i(0x10,(long)iVar71);
      ptr_02 = *parasail_memalign___m128i(0x10,(long)iVar71);
      ptr_03 = parasail_memalign___m128i(0x10,(long)iVar71);
      ptr_04 = parasail_memalign___m128i(0x10,(long)iVar71);
      if (b == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (b_00 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (b_01 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (b_02 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (b_03 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (b_04 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (b_05 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (b_06 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_00 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_01 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if ((__m128i *)ptr_02 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_03 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_04 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else {
        alVar97[0] = (long)iVar71;
        alVar97[1] = extraout_RDX;
        parasail_memset___m128i(b_03,alVar97,len);
        alVar91[0] = (long)iVar71;
        alVar91[1] = extraout_RDX_00;
        parasail_memset___m128i(b_04,alVar91,len);
        alVar92[0] = (long)iVar71;
        alVar92[1] = extraout_RDX_01;
        parasail_memset___m128i(b_05,alVar92,len);
        alVar93[0] = (long)iVar71;
        alVar93[1] = extraout_RDX_02;
        parasail_memset___m128i(b_06,alVar93,len);
        alVar94[0] = (long)iVar71;
        alVar94[1] = extraout_RDX_03;
        parasail_memset___m128i(b,alVar94,len);
        alVar95[0] = (long)iVar71;
        alVar95[1] = extraout_RDX_04;
        parasail_memset___m128i(b_00,alVar95,len);
        alVar96[0] = (long)iVar71;
        alVar96[1] = extraout_RDX_05;
        parasail_memset___m128i(b_01,alVar96,len);
        c[0] = (__m128i *)(long)iVar71;
        c[1] = extraout_RDX_06;
        array = *b_02;
        parasail_memset___m128i(b_02,c,len);
        vGapperL[1] = -(long)open;
        vGapper[0] = -(long)open;
        vE[1] = 1;
        vGapperL[0] = 1;
        end_query = iVar71;
        while (end_query = end_query + -1, -1 < end_query) {
          ptr_03[end_query][0] = vGapperL[1];
          ptr_03[end_query][1] = vGapper[0];
          len = (long)end_query * 0x10;
          ptr_04[end_query][0] = vE[1];
          ptr_04[end_query][1] = vGapperL[0];
          vGapperL[1] = vGapperL[1] - gap;
          vGapper[0] = vGapper[0] - gap;
          vE[1] = vE[1] + 1;
          vGapperL[0] = vGapperL[0] + 1;
        }
        uVar79 = extraout_RDX_07;
        matches = lVar73;
        for (end_ref = 0; end_ref < s2Len; end_ref = end_ref + 1) {
          vHpM[1] = 0;
          vHpS[1] = 0;
          vHpL[1] = 0;
          pvW = (__m128i *)0x0;
          iVar72 = ppVar2->mapper[(byte)s2[end_ref]];
          iVar1 = ppVar2->mapper[(byte)s2[end_ref]];
          c[0] = (__m128i *)(long)end_ref;
          uVar79 = (ulong)(byte)s2[(long)c[0]];
          lVar77 = (long)(ppVar2->mapper[uVar79] * iVar71) * 0x10;
          vHtM[1] = 0;
          vHt[0] = 0;
          stack0xffffffffffffeed8 = ZEXT816(0);
          stack0xffffffffffffeec8 = ZEXT816(0);
          stack0xffffffffffffeeb8 = ZEXT816(0);
          end_query = 0;
          b_24[1] = lVar77;
          vHpL[0] = b_06[iVar71 + -1][0];
          vHpS[0] = b_05[iVar71 + -1][0];
          vHpM[0] = b_04[iVar71 + -1][0];
          vHp[0] = b_03[iVar71 + -1][0];
          vF_ext[1] = lVar73;
          vF[0] = lVar73;
          while( true ) {
            lVar8 = vHtS[1];
            lVar7 = vHtL[1];
            lVar6 = vF[1];
            if (iVar71 <= end_query) break;
            lVar6 = b_03[end_query][0];
            lVar7 = b_03[end_query][1];
            vH_03[0] = b_04 + end_query;
            lVar8 = (*vH_03[0])[0];
            lVar78 = (*vH_03[0])[1];
            alVar91 = *vH_03[0];
            vH_03[0] = b_05 + end_query;
            lVar9 = (*vH_03[0])[0];
            lVar10 = (*vH_03[0])[1];
            alVar93 = *vH_03[0];
            palVar74 = b_06 + end_query;
            vH_03[0] = (__m128i *)(*palVar74)[0];
            lVar80 = (*palVar74)[1];
            alVar95 = *palVar74;
            alVar97 = b_00[end_query];
            alVar92 = b_01[end_query];
            alVar94 = b_02[end_query];
            plVar75 = (long *)((long)pvVar3 +
                              (long)end_query * 0x10 + (long)(iVar72 * iVar71) * 0x10);
            b_24[1] = *plVar75;
            b_19[1] = plVar75[1];
            plVar75 = (long *)((long)pvVar4 + (long)end_query * 0x10 + (long)(iVar1 * iVar71) * 0x10
                              );
            lVar81 = *plVar75;
            lVar85 = plVar75[1];
            plVar75 = (long *)((long)pvVar5 + (long)end_query * 0x10 + lVar77);
            lVar82 = *plVar75;
            lVar86 = plVar75[1];
            lVar11 = ptr_03[end_query][0];
            lVar12 = ptr_03[end_query][1];
            b_07[1] = (long)end_query * 0x10;
            lVar13 = ptr_04[end_query][0];
            lVar14 = ptr_04[end_query][1];
            b_07[0] = uVar79;
            a[1] = (longlong)c[0];
            a[0] = (longlong)array;
            alVar96 = _mm_cmpgt_epi64_rpl(a,b_07);
            b_08[0] = alVar96[1];
            b_08[1] = b_07[1];
            a_00[1] = (longlong)c[0];
            a_00[0] = (longlong)array;
            alVar96 = _mm_max_epi64_rpl(a_00,b_08);
            b_09[0] = alVar96[1];
            auVar51._8_8_ = extraout_XMM0_Qb;
            auVar51._0_8_ = extraout_XMM0_Qa;
            auVar88 = pblendvb((undefined1  [16])alVar97,(undefined1  [16])alVar91,auVar51);
            auVar50._8_8_ = extraout_XMM0_Qb;
            auVar50._0_8_ = extraout_XMM0_Qa;
            auVar89 = pblendvb((undefined1  [16])alVar92,(undefined1  [16])alVar93,auVar50);
            auVar49._8_8_ = extraout_XMM0_Qb;
            auVar49._0_8_ = extraout_XMM0_Qa;
            auVar90 = pblendvb((undefined1  [16])alVar94,(undefined1  [16])alVar95,auVar49);
            vHt[1] = auVar90._0_8_;
            vEL[0] = auVar90._8_8_;
            b_09[1] = b_07[1];
            a_01[1] = (longlong)c[0];
            a_01[0] = (longlong)array;
            alVar97 = _mm_cmpgt_epi64_rpl(a_01,b_09);
            b_10[0] = alVar97[1];
            uVar79 = extraout_XMM0_Qa_01 | -(ulong)(vF_ext[1] == vHtM[1] + lVar11);
            uVar84 = extraout_XMM0_Qb_01 | -(ulong)(vF[0] == vHt[0] + lVar12);
            b_10[1] = b_07[1];
            a_02[1] = (longlong)c[0];
            a_02[0] = (longlong)array;
            alVar97 = _mm_max_epi64_rpl(a_02,b_10);
            b_11[0] = alVar97[1];
            auVar48._8_8_ = uVar84;
            auVar48._0_8_ = uVar79;
            register0x00001240 = pblendvb(stack0xffffffffffffef38,stack0xffffffffffffeed8,auVar48);
            auVar47._8_8_ = uVar84;
            auVar47._0_8_ = uVar79;
            register0x00001240 = pblendvb(stack0xffffffffffffef28,stack0xffffffffffffeec8,auVar47);
            auVar46._8_8_ = vHtL[0] + lVar14;
            auVar46._0_8_ = vF[1] + lVar13;
            auVar45._8_8_ = uVar84;
            auVar45._0_8_ = uVar79;
            register0x00001240 = pblendvb(auVar46,stack0xffffffffffffeeb8,auVar45);
            lVar81 = vHpS[1] + lVar81;
            lVar85 = vHpM[0] + lVar85;
            lVar82 = vHpL[1] + lVar82;
            lVar86 = vHpS[0] + lVar86;
            puVar83 = (undefined1 *)((long)*pvW + 1);
            b_11[1] = b_07[1];
            a_03[1] = (longlong)c[0];
            a_03[0] = (longlong)array;
            alVar97 = _mm_cmpgt_epi64_rpl(a_03,b_11);
            b_12[0] = alVar97[1];
            b_12[1] = b_07[1];
            a_04[1] = (longlong)c[0];
            a_04[0] = (longlong)array;
            alVar97 = _mm_max_epi64_rpl(a_04,b_12);
            uVar79 = alVar97[1];
            vES[1] = auVar88._0_8_;
            vEM[0] = auVar88._8_8_;
            auVar44._8_8_ = lVar85;
            auVar44._0_8_ = lVar81;
            auVar43._8_8_ = extraout_XMM0_Qb_03;
            auVar43._0_8_ = extraout_XMM0_Qa_03;
            register0x00001240 = pblendvb(auVar44,auVar88,auVar43);
            vEL[1] = auVar89._0_8_;
            vES[0] = auVar89._8_8_;
            auVar42._8_8_ = lVar86;
            auVar42._0_8_ = lVar82;
            auVar41._8_8_ = extraout_XMM0_Qb_03;
            auVar41._0_8_ = extraout_XMM0_Qa_03;
            register0x00001240 = pblendvb(auVar42,auVar89,auVar41);
            auVar40._8_8_ = vHpL[0] + 1;
            auVar40._0_8_ = puVar83;
            auVar39._8_8_ = vEL[0] + 1;
            auVar39._0_8_ = vHt[1] + 1;
            auVar38._8_8_ = extraout_XMM0_Qb_03;
            auVar38._0_8_ = extraout_XMM0_Qa_03;
            register0x00001240 = pblendvb(auVar40,auVar39,auVar38);
            b[end_query][0] = extraout_XMM0_Qa_00;
            b[end_query][1] = extraout_XMM0_Qb_00;
            b_00[end_query][0] = vES[1];
            b_00[end_query][1] = vEM[0];
            b_01[end_query][0] = vEL[1];
            b_01[end_query][1] = vES[0];
            b_02[end_query][0] = vHt[1] + 1;
            b_02[end_query][1] = vEL[0] + 1;
            b_03[end_query][0] = vHpM[1] + b_24[1];
            b_03[end_query][1] = vHp[0] + b_19[1];
            b_04[end_query][0] = lVar81;
            b_04[end_query][1] = lVar85;
            b_05[end_query][0] = lVar82;
            b_05[end_query][1] = lVar86;
            b_24[1] = (long)end_query * 0x10;
            b_06[end_query][0] = (longlong)puVar83;
            b_06[end_query][1] = vHpL[0] + 1;
            end_query = end_query + 1;
            pvW = vH_03[0];
            vHpL[0] = lVar80;
            vHpL[1] = lVar9;
            vHpS[0] = lVar10;
            vHpS[1] = lVar8;
            vHpM[0] = lVar78;
            vHpM[1] = lVar6;
            vHp[0] = lVar7;
            vF_ext[1] = extraout_XMM0_Qa_02;
            vF[0] = extraout_XMM0_Qb_02;
            vHtM[1] = extraout_XMM0_Qa_04;
            vHt[0] = extraout_XMM0_Qb_04;
          }
          auVar54._8_8_ = 0;
          auVar54._0_8_ = vHtS[1];
          stack0xffffffffffffef38 = auVar54 << 0x40;
          auVar55._8_8_ = 0;
          auVar55._0_8_ = vHtL[1];
          stack0xffffffffffffef28 = auVar55 << 0x40;
          auVar56._8_8_ = 0;
          auVar56._0_8_ = vF[1];
          stack0xffffffffffffef18 = auVar56 << 0x40;
          lVar77 = (*ptr_03)[0];
          b_19[1] = (*ptr_03)[1];
          lVar78 = (*ptr_04)[0];
          lVar81 = (*ptr_04)[1];
          b_13[1] = b_24[1];
          b_13[0] = uVar79;
          a_05[1] = (longlong)c[0];
          a_05[0] = (longlong)array;
          alVar97 = _mm_cmpgt_epi64_rpl(a_05,b_13);
          b_14[0] = alVar97[1];
          uVar84 = extraout_XMM0_Qa_05 | -(ulong)(lVar77 == vF_ext[1]);
          uVar87 = extraout_XMM0_Qb_05 | -(ulong)(vHtM[1] + b_19[1] == vF[0]);
          b_14[1] = b_24[1];
          a_06[1] = (longlong)c[0];
          a_06[0] = (longlong)array;
          alVar97 = _mm_max_epi64_rpl(a_06,b_14);
          uVar79 = alVar97[1];
          auVar62._8_8_ = 0;
          auVar62._0_8_ = lVar8;
          auVar37._8_8_ = uVar87;
          auVar37._0_8_ = uVar84;
          register0x00001240 = pblendvb(stack0xffffffffffffeed8,auVar62 << 0x40,auVar37);
          auVar63._8_8_ = 0;
          auVar63._0_8_ = lVar7;
          auVar90._8_8_ = uVar87;
          auVar90._0_8_ = uVar84;
          register0x00001240 = pblendvb(stack0xffffffffffffeec8,auVar63 << 0x40,auVar90);
          auVar89._8_8_ = lVar6 + lVar81;
          auVar89._0_8_ = lVar78;
          auVar88._8_8_ = uVar87;
          auVar88._0_8_ = uVar84;
          register0x00001240 = pblendvb(stack0xffffffffffffeeb8,auVar89,auVar88);
          end_query = 0;
          vF_ext[1] = extraout_XMM0_Qa_06;
          vF[0] = extraout_XMM0_Qb_06;
          while( true ) {
            lVar10 = vFS[1];
            lVar9 = vFL[1];
            lVar78 = vH[1];
            if (-1 < end_query) break;
            b_15[1] = 0;
            b_15[0] = uVar79;
            lVar78 = 0;
            a_07[1] = (longlong)c[0];
            a_07[0] = (longlong)array;
            alVar97 = _mm_cmpgt_epi64_rpl(a_07,b_15);
            b_16[0] = alVar97[1];
            uVar84 = extraout_XMM0_Qa_07 | -(ulong)(lVar73 == vF_ext[1]);
            uVar87 = extraout_XMM0_Qb_07 | -(ulong)(vF_ext[1] + -iVar71 * gap == vF[0]);
            b_16[1] = lVar78;
            a_08[1] = (longlong)c[0];
            a_08[0] = (longlong)array;
            alVar97 = _mm_max_epi64_rpl(a_08,b_16);
            uVar79 = alVar97[1];
            auVar57._8_8_ = 0;
            auVar57._0_8_ = vFS[1];
            auVar36._8_8_ = uVar87;
            auVar36._0_8_ = uVar84;
            register0x00001240 = pblendvb(stack0xffffffffffffeed8,auVar57 << 0x40,auVar36);
            auVar58._8_8_ = 0;
            auVar58._0_8_ = vFL[1];
            auVar35._8_8_ = uVar87;
            auVar35._0_8_ = uVar84;
            register0x00001240 = pblendvb(stack0xffffffffffffeec8,auVar58 << 0x40,auVar35);
            auVar64._8_8_ = 0;
            auVar64._0_8_ = vH[1] + iVar71;
            auVar34._8_8_ = uVar87;
            auVar34._0_8_ = uVar84;
            register0x00001240 = pblendvb(stack0xffffffffffffeeb8,auVar64 << 0x40,auVar34);
            end_query = end_query + 1;
            vF_ext[1] = extraout_XMM0_Qa_08;
            vF[0] = extraout_XMM0_Qb_08;
          }
          auVar59._8_8_ = 0;
          auVar59._0_8_ = vFS[1];
          stack0xffffffffffffeed8 = auVar59 << 0x40;
          auVar60._8_8_ = 0;
          auVar60._0_8_ = vFL[1];
          stack0xffffffffffffeec8 = auVar60 << 0x40;
          auVar61._8_8_ = 0;
          auVar61._0_8_ = vH[1];
          stack0xffffffffffffeeb8 = auVar61 << 0x40;
          b_17[1] = 0;
          b_17[0] = uVar79;
          len = 0;
          a_09[1] = (longlong)c[0];
          a_09[0] = (longlong)array;
          alVar97 = _mm_cmpgt_epi64_rpl(a_09,b_17);
          b_18[0] = alVar97[1];
          b_18[1] = len;
          a_10[1] = (longlong)c[0];
          a_10[0] = (longlong)array;
          alVar97 = _mm_max_epi64_rpl(a_10,b_18);
          lVar80 = alVar97[1];
          auVar68._8_8_ = 0;
          auVar68._0_8_ = lVar8;
          auVar65._8_8_ = 0;
          auVar65._0_8_ = lVar10;
          auVar33._8_8_ = extraout_XMM0_Qb_09;
          auVar33._0_8_ = extraout_XMM0_Qa_09;
          register0x00001240 = pblendvb(auVar68 << 0x40,auVar65 << 0x40,auVar33);
          auVar69._8_8_ = 0;
          auVar69._0_8_ = lVar7;
          auVar66._8_8_ = 0;
          auVar66._0_8_ = lVar9;
          auVar32._8_8_ = extraout_XMM0_Qb_09;
          auVar32._0_8_ = extraout_XMM0_Qa_09;
          register0x00001240 = pblendvb(auVar69 << 0x40,auVar66 << 0x40,auVar32);
          auVar70._8_8_ = 0;
          auVar70._0_8_ = lVar6;
          auVar67._8_8_ = 0;
          auVar67._0_8_ = lVar78;
          auVar31._8_8_ = extraout_XMM0_Qb_09;
          auVar31._0_8_ = extraout_XMM0_Qa_09;
          register0x00001240 = pblendvb(auVar70 << 0x40,auVar67 << 0x40,auVar31);
          for (end_query = 0; end_query < iVar71; end_query = end_query + 1) {
            b_24[1] = b_03[end_query][0];
            lVar77 = b_03[end_query][1];
            alVar97 = b_04[end_query];
            alVar91 = b_05[end_query];
            alVar92 = b_06[end_query];
            alVar93 = b_00[end_query];
            alVar94 = b_01[end_query];
            b_19[1] = (long)end_query * 0x10;
            alVar95 = b_02[end_query];
            b_19[0] = lVar80;
            a_11[1] = (longlong)c[0];
            a_11[0] = (longlong)array;
            alVar96 = _mm_max_epi64_rpl(a_11,b_19);
            b_20[0] = alVar96[1];
            b_20[1] = b_19[1];
            a_12[1] = (longlong)c[0];
            a_12[0] = (longlong)array;
            alVar96 = _mm_cmpgt_epi64_rpl(a_12,b_20);
            b_21[0] = alVar96[1];
            auVar30._8_8_ = extraout_XMM0_Qb_11;
            auVar30._0_8_ = extraout_XMM0_Qa_11;
            register0x00001240 = pblendvb(stack0xffffffffffffeed8,stack0xffffffffffffee98,auVar30);
            auVar29._8_8_ = extraout_XMM0_Qb_11;
            auVar29._0_8_ = extraout_XMM0_Qa_11;
            register0x00001240 = pblendvb(stack0xffffffffffffeec8,stack0xffffffffffffee88,auVar29);
            auVar28._8_8_ = extraout_XMM0_Qb_11;
            auVar28._0_8_ = extraout_XMM0_Qa_11;
            auVar88 = pblendvb(stack0xffffffffffffeeb8,stack0xffffffffffffee78,auVar28);
            vH[1] = auVar88._0_8_;
            vFL[0] = auVar88._8_8_;
            vH[1] = vH[1] + 1;
            vFL[0] = vFL[0] + 1;
            b_21[1] = b_19[1];
            a_13[1] = (longlong)c[0];
            a_13[0] = (longlong)array;
            alVar96 = _mm_max_epi64_rpl(a_13,b_21);
            b_22[0] = alVar96[1];
            b_22[1] = b_19[1];
            a_14[1] = (longlong)c[0];
            a_14[0] = (longlong)array;
            alVar96 = _mm_max_epi64_rpl(a_14,b_22);
            b_23[0] = alVar96[1];
            b_23[1] = b_19[1];
            a_15[1] = (longlong)c[0];
            a_15[0] = (longlong)array;
            alVar96 = _mm_max_epi64_rpl(a_15,b_23);
            b_24[0] = alVar96[1];
            b_24[1] = -(ulong)(extraout_XMM0_Qa_12 == b_24[1]);
            lVar81 = -(ulong)(extraout_XMM0_Qb_12 == lVar77);
            lVar77 = -(ulong)(extraout_XMM0_Qa_12 == extraout_XMM0_Qa_10);
            lVar85 = -(ulong)(extraout_XMM0_Qb_12 == extraout_XMM0_Qb_10);
            b_19[1] = -(ulong)(extraout_XMM0_Qa_12 == 0);
            lVar82 = -(ulong)(extraout_XMM0_Qb_12 == 0);
            auVar27._8_8_ = lVar85;
            auVar27._0_8_ = lVar77;
            auVar88 = pblendvb((undefined1  [16])alVar93,register0x00001240,auVar27);
            auVar26._8_8_ = lVar81;
            auVar26._0_8_ = b_24[1];
            auVar88 = pblendvb(auVar88,(undefined1  [16])alVar97,auVar26);
            auVar25._8_8_ = lVar82;
            auVar25._0_8_ = b_19[1];
            register0x00001240 = pblendvb(auVar88,ZEXT816(0),auVar25);
            auVar24._8_8_ = lVar85;
            auVar24._0_8_ = lVar77;
            auVar88 = pblendvb((undefined1  [16])alVar94,register0x00001240,auVar24);
            auVar23._8_8_ = lVar81;
            auVar23._0_8_ = b_24[1];
            auVar88 = pblendvb(auVar88,(undefined1  [16])alVar91,auVar23);
            auVar22._8_8_ = lVar82;
            auVar22._0_8_ = b_19[1];
            register0x00001240 = pblendvb(auVar88,ZEXT816(0),auVar22);
            auVar21._8_8_ = vFL[0];
            auVar21._0_8_ = vH[1];
            auVar20._8_8_ = lVar85;
            auVar20._0_8_ = lVar77;
            auVar88 = pblendvb((undefined1  [16])alVar95,auVar21,auVar20);
            auVar19._8_8_ = lVar81;
            auVar19._0_8_ = b_24[1];
            auVar88 = pblendvb(auVar88,(undefined1  [16])alVar92,auVar19);
            auVar18._8_8_ = lVar82;
            auVar18._0_8_ = b_19[1];
            register0x00001240 = pblendvb(auVar88,ZEXT816(0),auVar18);
            b_03[end_query][0] = extraout_XMM0_Qa_12;
            b_03[end_query][1] = extraout_XMM0_Qb_12;
            b_04[end_query][0] = vHS[1];
            b_04[end_query][1] = vHM[0];
            b_05[end_query][0] = vHL[1];
            b_05[end_query][1] = vHS[0];
            b_24[1] = (long)end_query * 0x10;
            b_06[end_query][0] = vHp[1];
            b_06[end_query][1] = vHL[0];
            a_16[1] = (longlong)c[0];
            a_16[0] = (longlong)array;
            alVar97 = _mm_min_epi64_rpl(a_16,b_24);
            b_25[0] = alVar97[1];
            b_25[1] = b_24[1];
            a_17[1] = (longlong)c[0];
            a_17[0] = (longlong)array;
            alVar97 = _mm_max_epi64_rpl(a_17,b_25);
            b_26[0] = alVar97[1];
            b_26[1] = b_24[1];
            a_18[1] = (longlong)c[0];
            a_18[0] = (longlong)array;
            alVar97 = _mm_max_epi64_rpl(a_18,b_26);
            b_27[0] = alVar97[1];
            b_27[1] = b_24[1];
            a_19[1] = (longlong)c[0];
            a_19[0] = (longlong)array;
            alVar97 = _mm_max_epi64_rpl(a_19,b_27);
            b_28[0] = alVar97[1];
            b_28[1] = b_24[1];
            a_20[1] = (longlong)c[0];
            a_20[0] = (longlong)array;
            _mm_max_epi64_rpl(a_20,b_28);
            vH_00[0] = (ulong)(uint)end_query;
            vH_00[1]._0_4_ = iVar71;
            vH_00[1]._4_4_ = 0;
            arr_store_si128(*((anon_union_8_5_1bed06c4_for_parasail_result_4 *)
                             &profile_local->matrix)->trace->trace_del_table,vH_00,end_ref,s2Len,
                            in_R9D,(int32_t)in_stack_ffffffffffffecd8);
            vH_01[0] = (ulong)(uint)end_query;
            vH_01[1]._0_4_ = iVar71;
            vH_01[1]._4_4_ = 0;
            arr_store_si128(*(int **)((long)((anon_union_8_5_1bed06c4_for_parasail_result_4 *)
                                            &profile_local->matrix)->trace->trace_del_table + 8),
                            vH_01,end_ref,s2Len,in_R9D,(int32_t)in_stack_ffffffffffffecd8);
            vH_02[0] = (ulong)(uint)end_query;
            vH_02[1]._0_4_ = iVar71;
            vH_02[1]._4_4_ = 0;
            arr_store_si128(*(int **)((long)((anon_union_8_5_1bed06c4_for_parasail_result_4 *)
                                            &profile_local->matrix)->trace->trace_del_table + 0x10),
                            vH_02,end_ref,s2Len,in_R9D,(int32_t)in_stack_ffffffffffffecd8);
            array = *(longlong **)
                     ((long)((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&profile_local->matrix
                            )->trace->trace_del_table + 0x18);
            vH_03[0] = (__m128i *)(ulong)(uint)end_query;
            len = (size_t)(uint)end_ref;
            vH_03[1]._0_4_ = iVar71;
            vH_03[1]._4_4_ = 0;
            arr_store_si128((int *)array,vH_03,end_ref,s2Len,in_R9D,
                            (int32_t)in_stack_ffffffffffffecd8);
            b_29[1] = len;
            b_29[0] = extraout_RDX_08;
            a_21[1] = (longlong)vH_03[0];
            a_21[0] = (longlong)array;
            alVar97 = _mm_cmpgt_epi64_rpl(a_21,b_29);
            b_30[0] = alVar97[1];
            b_30[1] = len;
            a_22[1] = (longlong)vH_03[0];
            a_22[0] = (longlong)array;
            alVar97 = _mm_max_epi64_rpl(a_22,b_30);
            lVar80 = alVar97[1];
            auVar17._8_8_ = extraout_XMM0_Qb_13;
            auVar17._0_8_ = extraout_XMM0_Qa_13;
            register0x00001240 = pblendvb(stack0xfffffffffffff048,register0x00001240,auVar17);
            auVar16._8_8_ = extraout_XMM0_Qb_13;
            auVar16._0_8_ = extraout_XMM0_Qa_13;
            register0x00001240 = pblendvb(stack0xfffffffffffff038,register0x00001240,auVar16);
            auVar15._8_8_ = extraout_XMM0_Qb_13;
            auVar15._0_8_ = extraout_XMM0_Qa_13;
            register0x00001240 = pblendvb(stack0xfffffffffffff028,register0x00001240,auVar15);
            c[0] = vH_03[0];
          }
          b_31[1] = len;
          b_31[0] = lVar80;
          a_23[1] = (longlong)c[0];
          a_23[0] = (longlong)array;
          alVar97 = _mm_cmpgt_epi64_rpl(a_23,b_31);
          uVar79 = alVar97[1];
          auVar53._8_8_ = extraout_XMM0_Qb_14;
          auVar53._0_8_ = extraout_XMM0_Qa_14;
          if ((((((((((((((((auVar53 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar53 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar53 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar53 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar53 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar53 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar53 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar53 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (extraout_XMM0_Qb_14 >> 7 & 1) != 0) || (extraout_XMM0_Qb_14 >> 0xf & 1) != 0)
                  || (extraout_XMM0_Qb_14 >> 0x17 & 1) != 0) ||
                 (extraout_XMM0_Qb_14 >> 0x1f & 1) != 0) || (extraout_XMM0_Qb_14 >> 0x27 & 1) != 0)
               || (extraout_XMM0_Qb_14 >> 0x2f & 1) != 0) || (extraout_XMM0_Qb_14 >> 0x37 & 1) != 0)
              || (long)extraout_XMM0_Qb_14 < 0) {
            a_24[1] = (longlong)c[0];
            a_24[0] = (longlong)array;
            matches = _mm_hmax_epi64_rpl(a_24);
            matrix._4_4_ = end_ref;
            memcpy(ptr,b_03,(long)iVar71 << 4);
            memcpy(ptr_00,b_04,(long)iVar71 << 4);
            memcpy(ptr_01,b_05,(long)iVar71 << 4);
            c[0] = b_06;
            array = ptr_02;
            memcpy(ptr_02,b_06,(long)iVar71 << 4);
            uVar79 = extraout_RDX_09;
          }
        }
        end_query = 0;
        _temp = ptr_02;
        l = *ptr_01;
        s = *ptr_00;
        m = *ptr;
        while( true ) {
          if (iVar71 * 2 <= end_query) break;
          if (*m == matches) {
            uVar76 = (end_query % 2) * iVar71;
            uVar79 = (ulong)uVar76;
            iVar72 = end_query / 2 + uVar76;
            if (iVar72 < s1Len) {
              similar = *s;
              length = *l;
              vNegLimit[1] = *_temp;
              s1Len = iVar72;
            }
          }
          end_query = end_query + 1;
          m = m + 1;
          s = s + 1;
          l = l + 1;
          _temp = _temp + 1;
        }
        b_32[1] = len;
        b_32[0] = uVar79;
        a_25[1] = (longlong)c[0];
        a_25[0] = (longlong)array;
        alVar97 = _mm_cmplt_epi64_rpl(a_25,b_32);
        b_33[0] = alVar97[1];
        b_33[1] = len;
        a_26[1] = (longlong)c[0];
        a_26[0] = (longlong)array;
        uVar79 = extraout_XMM0_Qa_15;
        _mm_cmpgt_epi64_rpl(a_26,b_33);
        uVar84 = extraout_XMM0_Qb_15 | extraout_XMM0_Qb_16;
        auVar52._8_8_ = uVar84;
        auVar52._0_8_ = uVar79 | extraout_XMM0_Qa_16;
        if ((((((((((((((((auVar52 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar52 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar52 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar52 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar52 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar52 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar52 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar52 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (uVar84 >> 7 & 1) != 0) || (uVar84 >> 0xf & 1) != 0) || (uVar84 >> 0x17 & 1) != 0)
               || (uVar84 >> 0x1f & 1) != 0) || (uVar84 >> 0x27 & 1) != 0) ||
             (uVar84 >> 0x2f & 1) != 0) || (uVar84 >> 0x37 & 1) != 0) || (long)uVar84 < 0) {
          *(uint *)&profile_local->field_0xc = *(uint *)&profile_local->field_0xc | 0x40;
          matches = 0;
          similar._0_4_ = 0;
          length._0_4_ = 0;
          vNegLimit[1]._0_4_ = 0;
          s1Len = 0;
          matrix._4_4_ = 0;
        }
        *(int *)&profile_local->s1 = (int)matches;
        *(int32_t *)((long)&profile_local->s1 + 4) = s1Len;
        profile_local->s1Len = matrix._4_4_;
        ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&profile_local->matrix)->stats->matches =
             (int)similar;
        ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&profile_local->matrix)->stats->similar =
             (int)length;
        ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&profile_local->matrix)->stats->length =
             (int)vNegLimit[1];
        parasail_free(ptr_04);
        parasail_free(ptr_03);
        parasail_free(ptr_02);
        parasail_free(ptr_01);
        parasail_free(ptr_00);
        parasail_free(ptr);
        parasail_free(b_06);
        parasail_free(b_05);
        parasail_free(b_04);
        parasail_free(b_03);
        parasail_free(b_02);
        parasail_free(b_01);
        parasail_free(b_00);
        parasail_free(b);
      }
    }
  }
  return (parasail_result_t *)profile_local;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m128i* restrict pvP = NULL;
    __m128i* restrict pvPm = NULL;
    __m128i* restrict pvPs = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvEM = NULL;
    __m128i* restrict pvES = NULL;
    __m128i* restrict pvEL = NULL;
    __m128i* restrict pvH = NULL;
    __m128i* restrict pvHM = NULL;
    __m128i* restrict pvHS = NULL;
    __m128i* restrict pvHL = NULL;
    __m128i* restrict pvHMax = NULL;
    __m128i* restrict pvHMMax = NULL;
    __m128i* restrict pvHSMax = NULL;
    __m128i* restrict pvHLMax = NULL;
    __m128i* restrict pvGapper = NULL;
    __m128i* restrict pvGapperL = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    __m128i vZero;
    __m128i vOne;
    int64_t score = 0;
    int64_t matches = 0;
    int64_t similar = 0;
    int64_t length = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vMaxM;
    __m128i vMaxS;
    __m128i vMaxL;
    __m128i vMaxHUnit;
    __m128i vNegInfFront;
    __m128i vSegLenXgap;
    __m128i vSegLen;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 2; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    pvP  = (__m128i*)profile->profile64.score;
    pvPm = (__m128i*)profile->profile64.matches;
    pvPs = (__m128i*)profile->profile64.similar;
    vGapO = _mm_set1_epi64x_rpl(open);
    vGapE = _mm_set1_epi64x_rpl(gap);
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    vOne = _mm_set1_epi64x_rpl(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vMaxM = vNegLimit;
    vMaxS = vNegLimit;
    vMaxL = vNegLimit;
    vMaxHUnit = vNegLimit;
    vSegLen = _mm_slli_si128(_mm_set1_epi64x_rpl(segLen), 8);
    vNegInfFront = vZero;
    vNegInfFront = _mm_insert_epi64_rpl(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm_add_epi64(vNegInfFront,
            _mm_slli_si128(_mm_set1_epi64x_rpl(-segLen*gap), 8));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_2;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE  = parasail_memalign___m128i(16, segLen);
    pvEM = parasail_memalign___m128i(16, segLen);
    pvES = parasail_memalign___m128i(16, segLen);
    pvEL = parasail_memalign___m128i(16, segLen);
    pvH  = parasail_memalign___m128i(16, segLen);
    pvHM = parasail_memalign___m128i(16, segLen);
    pvHS = parasail_memalign___m128i(16, segLen);
    pvHL = parasail_memalign___m128i(16, segLen);
    pvHMax  = parasail_memalign___m128i(16, segLen);
    pvHMMax = parasail_memalign___m128i(16, segLen);
    pvHSMax = parasail_memalign___m128i(16, segLen);
    pvHLMax = parasail_memalign___m128i(16, segLen);
    pvGapper = parasail_memalign___m128i(16, segLen);
    pvGapperL = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!pvH) return NULL;
    if (!pvHM) return NULL;
    if (!pvHS) return NULL;
    if (!pvHL) return NULL;
    if (!pvHMax) return NULL;
    if (!pvHMMax) return NULL;
    if (!pvHSMax) return NULL;
    if (!pvHLMax) return NULL;
    if (!pvGapper) return NULL;
    if (!pvGapperL) return NULL;

    parasail_memset___m128i(pvH, vZero, segLen);
    parasail_memset___m128i(pvHM, vZero, segLen);
    parasail_memset___m128i(pvHS, vZero, segLen);
    parasail_memset___m128i(pvHL, vZero, segLen);
    parasail_memset___m128i(pvE, vNegLimit, segLen);
    parasail_memset___m128i(pvEM, vZero, segLen);
    parasail_memset___m128i(pvES, vZero, segLen);
    parasail_memset___m128i(pvEL, vZero, segLen);
    {
        __m128i vGapper = _mm_sub_epi64(vZero,vGapO);
        __m128i vGapperL = vOne;
        for (i=segLen-1; i>=0; --i) {
            _mm_store_si128(pvGapper+i, vGapper);
            _mm_store_si128(pvGapperL+i, vGapperL);
            vGapper = _mm_sub_epi64(vGapper, vGapE);
            vGapperL = _mm_add_epi64(vGapperL, vOne);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vE_ext;
        __m128i vE_opn;
        __m128i vEM;
        __m128i vES;
        __m128i vEL;
        __m128i vHt;
        __m128i vHtM;
        __m128i vHtS;
        __m128i vHtL;
        __m128i vF;
        __m128i vF_ext;
        __m128i vF_opn;
        __m128i vFM;
        __m128i vFS;
        __m128i vFL;
        __m128i vH;
        __m128i vHM;
        __m128i vHS;
        __m128i vHL;
        __m128i vHp;
        __m128i vHpM;
        __m128i vHpS;
        __m128i vHpL;
        __m128i *pvW;
        __m128i vW;
        __m128i *pvWM;
        __m128i vWM;
        __m128i *pvWS;
        __m128i vWS;
        __m128i case1;
        __m128i case2;
        __m128i case0;
        __m128i vGapper;
        __m128i vGapperL;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm_load_si128(pvH+(segLen-1));
        vHpM = _mm_load_si128(pvHM+(segLen-1));
        vHpS = _mm_load_si128(pvHS+(segLen-1));
        vHpL = _mm_load_si128(pvHL+(segLen-1));
        vHp = _mm_slli_si128(vHp, 8);
        vHpM = _mm_slli_si128(vHpM, 8);
        vHpS = _mm_slli_si128(vHpS, 8);
        vHpL = _mm_slli_si128(vHpL, 8);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWM= pvPm+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWS= pvPs+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = vZero;
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vZero;
        for (i=0; i<segLen; ++i) {
            vH = _mm_load_si128(pvH+i);
            vHM= _mm_load_si128(pvHM+i);
            vHS= _mm_load_si128(pvHS+i);
            vHL= _mm_load_si128(pvHL+i);
            vE = _mm_load_si128(pvE+i);
            vEM= _mm_load_si128(pvEM+i);
            vES= _mm_load_si128(pvES+i);
            vEL= _mm_load_si128(pvEL+i);
            vW = _mm_load_si128(pvW+i);
            vWM = _mm_load_si128(pvWM+i);
            vWS = _mm_load_si128(pvWS+i);
            vGapper = _mm_load_si128(pvGapper+i);
            vGapperL = _mm_load_si128(pvGapperL+i);
            vE_opn = _mm_sub_epi64(vH, vGapO);
            vE_ext = _mm_sub_epi64(vE, vGapE);
            case1 = _mm_cmpgt_epi64_rpl(vE_opn, vE_ext);
            vE = _mm_max_epi64_rpl(vE_opn, vE_ext);
            vEM = _mm_blendv_epi8(vEM, vHM, case1);
            vES = _mm_blendv_epi8(vES, vHS, case1);
            vEL = _mm_blendv_epi8(vEL, vHL, case1);
            vEL = _mm_add_epi64(vEL, vOne);
            vGapper = _mm_add_epi64(vHt, vGapper);
            case1 = _mm_or_si128(
                    _mm_cmpgt_epi64_rpl(vF, vGapper),
                    _mm_cmpeq_epi64(vF, vGapper));
            vF = _mm_max_epi64_rpl(vF, vGapper);
            vFM = _mm_blendv_epi8(vHtM, vFM, case1);
            vFS = _mm_blendv_epi8(vHtS, vFS, case1);
            vFL = _mm_blendv_epi8(
                    _mm_add_epi64(vHtL, vGapperL),
                    vFL, case1);
            vHp = _mm_add_epi64(vHp, vW);
            vHpM = _mm_add_epi64(vHpM, vWM);
            vHpS = _mm_add_epi64(vHpS, vWS);
            vHpL = _mm_add_epi64(vHpL, vOne);
            case1 = _mm_cmpgt_epi64_rpl(vE, vHp);
            vHt = _mm_max_epi64_rpl(vE, vHp);
            vHtM = _mm_blendv_epi8(vHpM, vEM, case1);
            vHtS = _mm_blendv_epi8(vHpS, vES, case1);
            vHtL = _mm_blendv_epi8(vHpL, vEL, case1);
            _mm_store_si128(pvE+i, vE);
            _mm_store_si128(pvEM+i, vEM);
            _mm_store_si128(pvES+i, vES);
            _mm_store_si128(pvEL+i, vEL);
            _mm_store_si128(pvH+i, vHp);
            _mm_store_si128(pvHM+i, vHpM);
            _mm_store_si128(pvHS+i, vHpS);
            _mm_store_si128(pvHL+i, vHpL);
            vHp = vH;
            vHpM = vHM;
            vHpS = vHS;
            vHpL = vHL;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm_slli_si128(vHt, 8);
        vHtM = _mm_slli_si128(vHtM, 8);
        vHtS = _mm_slli_si128(vHtS, 8);
        vHtL = _mm_slli_si128(vHtL, 8);
        vGapper = _mm_load_si128(pvGapper);
        vGapperL = _mm_load_si128(pvGapperL);
        vGapper = _mm_add_epi64(vHt, vGapper);
        case1 = _mm_or_si128(
                _mm_cmpgt_epi64_rpl(vGapper, vF),
                _mm_cmpeq_epi64(vGapper, vF));
        vF = _mm_max_epi64_rpl(vF, vGapper);
        vFM = _mm_blendv_epi8(vFM, vHtM, case1);
        vFS = _mm_blendv_epi8(vFS, vHtS, case1);
        vFL = _mm_blendv_epi8(
                vFL,
                _mm_add_epi64(vHtL, vGapperL),
                case1);
        for (i=0; i<segWidth-2; ++i) {
            __m128i vFt = _mm_slli_si128(vF, 8);
            __m128i vFtM = _mm_slli_si128(vFM, 8);
            __m128i vFtS = _mm_slli_si128(vFS, 8);
            __m128i vFtL = _mm_slli_si128(vFL, 8);
            vFt = _mm_add_epi64(vFt, vSegLenXgap);
            case1 = _mm_or_si128(
                    _mm_cmpgt_epi64_rpl(vFt, vF),
                    _mm_cmpeq_epi64(vFt, vF));
            vF = _mm_max_epi64_rpl(vF, vFt);
            vFM = _mm_blendv_epi8(vFM, vFtM, case1);
            vFS = _mm_blendv_epi8(vFS, vFtS, case1);
            vFL = _mm_blendv_epi8(
                    vFL,
                    _mm_add_epi64(vFtL, vSegLen),
                    case1);
        }

        /* calculate final H */
        vF = _mm_slli_si128(vF, 8);
        vFM = _mm_slli_si128(vFM, 8);
        vFS = _mm_slli_si128(vFS, 8);
        vFL = _mm_slli_si128(vFL, 8);
        vF = _mm_add_epi64(vF, vNegInfFront);
        case1 = _mm_cmpgt_epi64_rpl(vF, vHt);
        vH = _mm_max_epi64_rpl(vF, vHt);
        vHM = _mm_blendv_epi8(vHtM, vFM, case1);
        vHS = _mm_blendv_epi8(vHtS, vFS, case1);
        vHL = _mm_blendv_epi8(vHtL, vFL, case1);
        for (i=0; i<segLen; ++i) {
            vHp = _mm_load_si128(pvH+i);
            vHpM = _mm_load_si128(pvHM+i);
            vHpS = _mm_load_si128(pvHS+i);
            vHpL = _mm_load_si128(pvHL+i);
            vE = _mm_load_si128(pvE+i);
            vEM = _mm_load_si128(pvEM+i);
            vES = _mm_load_si128(pvES+i);
            vEL = _mm_load_si128(pvEL+i);
            vF_opn = _mm_sub_epi64(vH, vGapO);
            vF_ext = _mm_sub_epi64(vF, vGapE);
            vF = _mm_max_epi64_rpl(vF_opn, vF_ext);
            case1 = _mm_cmpgt_epi64_rpl(vF_opn, vF_ext);
            vFM = _mm_blendv_epi8(vFM, vHM, case1);
            vFS = _mm_blendv_epi8(vFS, vHS, case1);
            vFL = _mm_blendv_epi8(vFL, vHL, case1);
            vFL = _mm_add_epi64(vFL, vOne);
            vH = _mm_max_epi64_rpl(vHp, vE);
            vH = _mm_max_epi64_rpl(vH, vF);
            vH = _mm_max_epi64_rpl(vH, vZero);
            case1 = _mm_cmpeq_epi64(vH, vHp);
            case2 = _mm_cmpeq_epi64(vH, vF);
            case0 = _mm_cmpeq_epi64(vH, vZero);
            vHM = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEM, vFM, case2),
                    vHpM, case1);
            vHM = _mm_blendv_epi8(vHM, vZero, case0);
            vHS = _mm_blendv_epi8(
                    _mm_blendv_epi8(vES, vFS, case2),
                    vHpS, case1);
            vHS = _mm_blendv_epi8(vHS, vZero, case0);
            vHL = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEL, vFL, case2),
                    vHpL, case1);
            vHL = _mm_blendv_epi8(vHL, vZero, case0);
            _mm_store_si128(pvH+i, vH);
            _mm_store_si128(pvHM+i, vHM);
            _mm_store_si128(pvHS+i, vHS);
            _mm_store_si128(pvHL+i, vHL);
            vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
#endif
            {
                __m128i cond_max = _mm_cmpgt_epi64_rpl(vH, vMaxH);
                vMaxH = _mm_max_epi64_rpl(vH, vMaxH);
                vMaxM = _mm_blendv_epi8(vMaxM, vHM, cond_max);
                vMaxS = _mm_blendv_epi8(vMaxS, vHS, cond_max);
                vMaxL = _mm_blendv_epi8(vMaxL, vHL, cond_max);
            }
        } 

        {
            __m128i vCompare = _mm_cmpgt_epi64_rpl(vMaxH, vMaxHUnit);
            if (_mm_movemask_epi8(vCompare)) {
                score = _mm_hmax_epi64_rpl(vMaxH);
                vMaxHUnit = _mm_set1_epi64x_rpl(score);
                end_ref = j;
                (void)memcpy(pvHMax, pvH, sizeof(__m128i)*segLen);
                (void)memcpy(pvHMMax, pvHM, sizeof(__m128i)*segLen);
                (void)memcpy(pvHSMax, pvHS, sizeof(__m128i)*segLen);
                (void)memcpy(pvHLMax, pvHL, sizeof(__m128i)*segLen);
            }
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            int32_t k = 0;
            __m128i vH = _mm_load_si128(pvH + offset);
            __m128i vHM = _mm_load_si128(pvHM + offset);
            __m128i vHS = _mm_load_si128(pvHS + offset);
            __m128i vHL = _mm_load_si128(pvHL + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 8);
                vHM = _mm_slli_si128(vHM, 8);
                vHS = _mm_slli_si128(vHS, 8);
                vHL = _mm_slli_si128(vHL, 8);
            }
            result->stats->rowcols->score_row[j] = (int64_t) _mm_extract_epi64_rpl (vH, 1);
            result->stats->rowcols->matches_row[j] = (int64_t) _mm_extract_epi64_rpl (vHM, 1);
            result->stats->rowcols->similar_row[j] = (int64_t) _mm_extract_epi64_rpl (vHS, 1);
            result->stats->rowcols->length_row[j] = (int64_t) _mm_extract_epi64_rpl (vHL, 1);
        }
#endif
    }

    /* Trace the alignment ending position on read. */
    {
        int64_t *t = (int64_t*)pvHMax;
        int64_t *m = (int64_t*)pvHMMax;
        int64_t *s = (int64_t*)pvHSMax;
        int64_t *l = (int64_t*)pvHLMax;
        int32_t column_len = segLen * segWidth;
        end_query = s1Len;
        for (i = 0; i<column_len; ++i, ++t, ++m, ++s, ++l) {
            if (*t == score) {
                int32_t temp = i / segWidth + i % segWidth * segLen;
                if (temp < end_query) {
                    end_query = temp;
                    matches = *m;
                    similar = *s;
                    length = *l;
                }
            }
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH+i);
        __m128i vHM = _mm_load_si128(pvHM+i);
        __m128i vHS = _mm_load_si128(pvHS+i);
        __m128i vHL = _mm_load_si128(pvHL+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi64_rpl(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(pvGapperL);
    parasail_free(pvGapper);
    parasail_free(pvHLMax);
    parasail_free(pvHSMax);
    parasail_free(pvHMMax);
    parasail_free(pvHMax);
    parasail_free(pvHL);
    parasail_free(pvHS);
    parasail_free(pvHM);
    parasail_free(pvH);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);

    return result;
}